

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O1

TaskExecutionResult __thiscall
duckdb::UngroupedDistinctAggregateFinalizeTask::AggregateDistinct
          (UngroupedDistinctAggregateFinalizeTask *this)

{
  _Atomic_word *p_Var1;
  idx_t *__k;
  DataChunk *this_00;
  PhysicalUngroupedAggregate *pPVar2;
  size_type __n;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var3;
  ClientContext *context;
  undefined8 uVar4;
  SourceResultType SVar5;
  int iVar6;
  type pDVar7;
  type pDVar8;
  UngroupedDistinctAggregateFinalizeEvent *this_01;
  const_reference this_02;
  pointer this_03;
  size_type sVar9;
  mapped_type *pmVar10;
  reference this_04;
  type this_05;
  pointer pVVar11;
  reference this_06;
  reference this_07;
  reference this_08;
  pointer this_09;
  reference this_10;
  pointer pGVar12;
  reference this_11;
  reference other;
  TaskExecutionResult TVar13;
  ulong __n_00;
  size_type __n_01;
  long lVar14;
  uint uVar15;
  ExecutionContext execution_context;
  DataChunk output_chunk;
  OperatorSourceInput source_input;
  InterruptState interrupt_state;
  DataChunk payload_chunk;
  ThreadContext thread_context;
  weak_ptr<duckdb::Task,_true> local_210;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_200;
  vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
  *local_1f8;
  enable_shared_from_this<duckdb::Task> *local_1f0;
  vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
  *local_1e8;
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
  *local_1e0;
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
  *local_1d8;
  type local_1d0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_1c8;
  BoundAggregateExpression *local_1c0;
  type local_1b8;
  ExecutionContext local_1b0;
  undefined1 local_198 [88];
  undefined1 local_140 [64];
  pointer local_100;
  ThreadContext local_d8;
  
  pDVar7 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
           ::operator*(&this->gstate->distinct_state);
  pDVar8 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
           ::operator*(&this->op->distinct_data);
  pPVar2 = this->op;
  ThreadContext::ThreadContext(&local_d8,((this->super_ExecutorTask).executor)->context);
  local_1b0.client = ((this->super_ExecutorTask).executor)->context;
  local_1b0.pipeline.ptr = (Pipeline *)0x0;
  local_1b0.thread = &local_d8;
  this_01 = (UngroupedDistinctAggregateFinalizeEvent *)
            shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  __n_00 = this->aggregation_idx;
  if (__n_00 < (ulong)((long)(pPVar2->aggregates).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar2->aggregates).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_1c8 = &pPVar2->aggregates;
    __k = &this->aggregation_idx;
    local_1d8 = &pDVar8->radix_tables;
    local_1e0 = &this->radix_table_lstate;
    local_1e8 = &pDVar7->radix_states;
    local_1f0 = &(this->super_ExecutorTask).super_Task.super_enable_shared_from_this<duckdb::Task>;
    local_1f8 = &this_01->global_source_states;
    local_200 = &pDVar7->distinct_output_chunks;
    this_00 = (DataChunk *)(local_140 + 0x28);
    local_1d0 = pDVar8;
    do {
      pDVar8 = local_1d0;
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](local_1c8,__n_00);
      this_03 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_02);
      local_1c0 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                            (&this_03->super_BaseExpression);
      local_198._0_8_ = *__k;
      if (((pDVar8->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (pDVar8->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (sVar9 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&(pDVar8->info->table_map)._M_h,(key_type *)local_198), sVar9 == 0)) {
        uVar15 = 0;
      }
      else {
        pmVar10 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&pDVar8->info->table_map,__k);
        __n = *pmVar10;
        this_04 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                  ::operator[](local_1d8,__n);
        this_05 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator*(this_04);
        if (this->blocked == false) {
          RadixPartitionedHashTable::GetLocalSourceState
                    ((RadixPartitionedHashTable *)local_198,(ExecutionContext *)this_05);
          uVar4 = local_198._0_8_;
          local_198._0_8_ = (element_type *)0x0;
          _Var3._M_head_impl =
               (this->radix_table_lstate).
               super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
               .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
          (this->radix_table_lstate).
          super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
          .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
               (LocalSourceState *)uVar4;
          if (_Var3._M_head_impl != (LocalSourceState *)0x0) {
            (*(_Var3._M_head_impl)->_vptr_LocalSourceState[1])();
          }
          if ((element_type *)local_198._0_8_ != (element_type *)0x0) {
            (*(*(_func_int ***)&((_Rep_type *)local_198._0_8_)->_M_impl)[1])();
          }
        }
        pVVar11 = (pointer)unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                           ::operator*(local_1e0);
        this_06 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::operator[](local_1e8,__n);
        local_1b8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                    ::operator*(this_06);
        enable_shared_from_this<duckdb::Task>::shared_from_this
                  ((enable_shared_from_this<duckdb::Task> *)local_198);
        local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_198._0_8_;
        local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_198._8_8_ + 0xc) = *(_Atomic_word *)(local_198._8_8_ + 0xc) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_198._8_8_ + 0xc) = *(_Atomic_word *)(local_198._8_8_ + 0xc) + 1;
          }
        }
        InterruptState::InterruptState((InterruptState *)local_140,&local_210);
        if (local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_weak_count;
            iVar6 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar6 = (local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
            (local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
          }
          if (iVar6 == 1) {
            (*(local_210.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        this_07 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                  ::operator[](local_1f8,*__k);
        local_198._64_8_ =
             unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(this_07);
        local_198._80_8_ = local_140;
        local_198._72_8_ = pVVar11;
        DataChunk::DataChunk((DataChunk *)local_198);
        context = ((this->super_ExecutorTask).executor)->context;
        this_08 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                  ::operator[](local_200,__n);
        this_09 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->(this_08);
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)this_00,this_09);
        DataChunk::Initialize
                  ((DataChunk *)local_198,context,(vector<duckdb::LogicalType,_true> *)this_00,0x800
                  );
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00);
        DataChunk::DataChunk(this_00);
        this_10 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                  ::operator[](&pDVar8->grouped_aggregate_data,__n);
        pGVar12 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                  ::operator->(this_10);
        DataChunk::InitializeEmpty(this_00,&pGVar12->group_types);
        local_100 = (pointer)0x0;
        do {
          DataChunk::Reset((DataChunk *)local_198);
          SVar5 = RadixPartitionedHashTable::GetData
                            (this_05,&local_1b0,(DataChunk *)local_198,local_1b8,
                             (OperatorSourceInput *)(local_198 + 0x40));
          if (SVar5 == FINISHED) {
            uVar15 = 6;
          }
          else if (SVar5 == BLOCKED) {
            this->blocked = true;
            uVar15 = 1;
          }
          else {
            lVar14 = (long)(local_1c0->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_1c0->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (lVar14 != 0) {
              lVar14 = lVar14 >> 3;
              __n_01 = 0;
              do {
                this_11 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)this_00,__n_01);
                other = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)local_198,__n_01);
                Vector::Reference(this_11,other);
                __n_01 = __n_01 + 1;
              } while (lVar14 + (ulong)(lVar14 == 0) != __n_01);
            }
            local_100 = (pointer)local_198._24_8_;
            uVar15 = 0;
            LocalUngroupedAggregateState::Sink(&this->aggregate_state,this_00,0,*__k);
          }
        } while (uVar15 == 0);
        if (uVar15 == 6) {
          this->blocked = false;
          uVar15 = 0;
        }
        DataChunk::~DataChunk(this_00);
        DataChunk::~DataChunk((DataChunk *)local_198);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._32_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_140._32_8_ + 0xc);
            iVar6 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar6 = *(_Atomic_word *)(local_140._32_8_ + 0xc);
            *(int *)(local_140._32_8_ + 0xc) = iVar6 + -1;
          }
          if (iVar6 == 1) {
            (**(code **)(*(long *)local_140._32_8_ + 0x18))();
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_140._16_8_ + 0xc);
            iVar6 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar6 = *(_Atomic_word *)(local_140._16_8_ + 0xc);
            *(int *)(local_140._16_8_ + 0xc) = iVar6 + -1;
          }
          if (iVar6 == 1) {
            (*(*(_func_int ***)local_140._16_8_)[3])();
          }
        }
      }
      if ((uVar15 & 3) != 0) {
        TVar13 = TASK_BLOCKED;
        goto LAB_01668ae0;
      }
      __n_00 = *__k + 1;
      *__k = __n_00;
      pDVar8 = local_1d0;
    } while (__n_00 < (ulong)((long)(pPVar2->aggregates).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pPVar2->aggregates).
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  GlobalUngroupedAggregateState::CombineDistinct(&this->gstate->state,&this->aggregate_state,pDVar8)
  ;
  UngroupedDistinctAggregateFinalizeEvent::FinalizeTask(this_01);
  TVar13 = TASK_FINISHED;
LAB_01668ae0:
  ThreadContext::~ThreadContext(&local_d8);
  return TVar13;
}

Assistant:

TaskExecutionResult UngroupedDistinctAggregateFinalizeTask::AggregateDistinct() {
	D_ASSERT(gstate.distinct_state);
	auto &distinct_state = *gstate.distinct_state;
	auto &distinct_data = *op.distinct_data;

	auto &aggregates = op.aggregates;
	auto &state = aggregate_state;

	// Thread-local contexts
	ThreadContext thread_context(executor.context);
	ExecutionContext execution_context(executor.context, thread_context, nullptr);

	auto &finalize_event = event->Cast<UngroupedDistinctAggregateFinalizeEvent>();

	// Now loop through the distinct aggregates, scanning the distinct HTs

	// This needs to be preserved in case the radix_table.GetData blocks
	auto &agg_idx = aggregation_idx;

	for (; agg_idx < aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			continue;
		}

		const auto table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table = *distinct_data.radix_tables[table_idx];
		if (!blocked) {
			// Because we can block, we need to make sure we preserve this state
			radix_table_lstate = radix_table.GetLocalSourceState(execution_context);
		}
		auto &lstate = *radix_table_lstate;

		auto &sink = *distinct_state.radix_states[table_idx];
		InterruptState interrupt_state(shared_from_this());
		OperatorSourceInput source_input {*finalize_event.global_source_states[agg_idx], lstate, interrupt_state};

		DataChunk output_chunk;
		output_chunk.Initialize(executor.context, distinct_state.distinct_output_chunks[table_idx]->GetTypes());

		DataChunk payload_chunk;
		payload_chunk.InitializeEmpty(distinct_data.grouped_aggregate_data[table_idx]->group_types);
		payload_chunk.SetCardinality(0);

		while (true) {
			output_chunk.Reset();

			auto res = radix_table.GetData(execution_context, output_chunk, sink, source_input);
			if (res == SourceResultType::FINISHED) {
				D_ASSERT(output_chunk.size() == 0);
				break;
			} else if (res == SourceResultType::BLOCKED) {
				blocked = true;
				return TaskExecutionResult::TASK_BLOCKED;
			}

			// We dont need to resolve the filter, we already did this in Sink
			idx_t payload_cnt = aggregate.children.size();
			for (idx_t i = 0; i < payload_cnt; i++) {
				payload_chunk.data[i].Reference(output_chunk.data[i]);
			}
			payload_chunk.SetCardinality(output_chunk);

			// Update the aggregate state
			state.Sink(payload_chunk, 0, agg_idx);
		}
		blocked = false;
	}

	// After scanning the distinct HTs, we can combine the thread-local agg states with the thread-global
	gstate.state.CombineDistinct(state, distinct_data);
	finalize_event.FinalizeTask();
	return TaskExecutionResult::TASK_FINISHED;
}